

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O3

ostream * Eigen::internal::print_matrix<Eigen::Matrix<double,3,1,0,3,1>>
                    (ostream *s,Matrix<double,_3,_1,_0,_3,_1> *_m,IOFormat *fmt)

{
  ostream *poVar1;
  ostream oVar2;
  int iVar3;
  undefined8 uVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  Index i;
  stringstream sstr;
  ostream local_1f9;
  long local_1f8;
  undefined8 local_1f0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  long local_1b8 [16];
  ios_base local_138 [264];
  
  iVar3 = fmt->precision;
  lVar6 = (long)iVar3;
  if (lVar6 == -2) {
    lVar6 = 0xf;
  }
  else {
    bVar5 = true;
    if ((iVar3 == -1) || (iVar3 == 0)) {
      local_1f0 = 0;
      goto LAB_001143d4;
    }
  }
  local_1f0 = *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8);
  *(long *)(s + *(long *)(*(long *)s + -0x18) + 8) = lVar6;
  bVar5 = false;
LAB_001143d4:
  if ((fmt->flags & 1) == 0) {
    lVar6 = 0;
    local_1f8 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::ios::copyfmt((ios *)((stringstream *)local_1b8 + *(long *)(local_1b8[0] + -0x18)));
      std::ostream::_M_insert<double>
                ((_m->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                 .array[lVar6]);
      std::__cxx11::stringbuf::str();
      if (local_1f8 <= local_1d0) {
        local_1f8 = local_1d0;
      }
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
  }
  else {
    local_1f8 = 0;
  }
  lVar6 = *(long *)(*(long *)s + -0x18);
  poVar1 = s + lVar6;
  uVar4 = *(undefined8 *)(s + lVar6 + 0x10);
  if (s[lVar6 + 0xe1] == (ostream)0x1) {
    local_1f9 = poVar1[0xe0];
  }
  else {
    local_1f9 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = local_1f9;
    poVar1[0xe1] = (ostream)0x1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (s,(fmt->matPrefix)._M_dataplus._M_p,(fmt->matPrefix)._M_string_length);
  lVar6 = 0;
  while( true ) {
    if (lVar6 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (s,(fmt->rowSpacer)._M_dataplus._M_p,(fmt->rowSpacer)._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (s,(fmt->rowPrefix)._M_dataplus._M_p,(fmt->rowPrefix)._M_string_length);
    if (local_1f8 != 0) {
      lVar7 = *(long *)s;
      poVar1 = s + *(long *)(lVar7 + -0x18);
      oVar2 = (ostream)fmt->fill;
      if (s[*(long *)(lVar7 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar1);
        poVar1[0xe1] = (ostream)0x1;
        lVar7 = *(long *)s;
      }
      poVar1[0xe0] = oVar2;
      *(long *)(s + *(long *)(lVar7 + -0x18) + 0x10) = local_1f8;
    }
    std::ostream::_M_insert<double>
              ((_m->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
               array[lVar6]);
    std::__ostream_insert<char,std::char_traits<char>>
              (s,(fmt->rowSuffix)._M_dataplus._M_p,(fmt->rowSuffix)._M_string_length);
    if (lVar6 == 2) break;
    std::__ostream_insert<char,std::char_traits<char>>
              (s,(fmt->rowSeparator)._M_dataplus._M_p,(fmt->rowSeparator)._M_string_length);
    lVar6 = lVar6 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (s,(fmt->matSuffix)._M_dataplus._M_p,(fmt->matSuffix)._M_string_length);
  if (!bVar5) {
    *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8) = local_1f0;
  }
  if (local_1f8 != 0) {
    lVar6 = *(long *)s;
    poVar1 = s + *(long *)(lVar6 + -0x18);
    if (s[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar1);
      poVar1[0xe1] = (ostream)0x1;
      lVar6 = *(long *)s;
    }
    poVar1[0xe0] = local_1f9;
    *(undefined8 *)(s + *(long *)(lVar6 + -0x18) + 0x10) = uVar4;
  }
  return s;
}

Assistant:

std::ostream & print_matrix(std::ostream & s, const Derived& _m, const IOFormat& fmt)
{
  using internal::is_same;
  using internal::conditional;

  if(_m.size() == 0)
  {
    s << fmt.matPrefix << fmt.matSuffix;
    return s;
  }
  
  typename Derived::Nested m = _m;
  typedef typename Derived::Scalar Scalar;
  typedef typename
      conditional<
          is_same<Scalar, char>::value ||
            is_same<Scalar, unsigned char>::value ||
            is_same<Scalar, numext::int8_t>::value ||
            is_same<Scalar, numext::uint8_t>::value,
          int,
          typename conditional<
              is_same<Scalar, std::complex<char> >::value ||
                is_same<Scalar, std::complex<unsigned char> >::value ||
                is_same<Scalar, std::complex<numext::int8_t> >::value ||
                is_same<Scalar, std::complex<numext::uint8_t> >::value,
              std::complex<int>,
              const Scalar&
            >::type
        >::type PrintType;

  Index width = 0;

  std::streamsize explicit_precision;
  if(fmt.precision == StreamPrecision)
  {
    explicit_precision = 0;
  }
  else if(fmt.precision == FullPrecision)
  {
    if (NumTraits<Scalar>::IsInteger)
    {
      explicit_precision = 0;
    }
    else
    {
      explicit_precision = significant_decimals_impl<Scalar>::run();
    }
  }
  else
  {
    explicit_precision = fmt.precision;
  }

  std::streamsize old_precision = 0;
  if(explicit_precision) old_precision = s.precision(explicit_precision);

  bool align_cols = !(fmt.flags & DontAlignCols);
  if(align_cols)
  {
    // compute the largest width
    for(Index j = 0; j < m.cols(); ++j)
      for(Index i = 0; i < m.rows(); ++i)
      {
        std::stringstream sstr;
        sstr.copyfmt(s);
        sstr << static_cast<PrintType>(m.coeff(i,j));
        width = std::max<Index>(width, Index(sstr.str().length()));
      }
  }
  std::streamsize old_width = s.width();
  char old_fill_character = s.fill();
  s << fmt.matPrefix;
  for(Index i = 0; i < m.rows(); ++i)
  {
    if (i)
      s << fmt.rowSpacer;
    s << fmt.rowPrefix;
    if(width) {
      s.fill(fmt.fill);
      s.width(width);
    }
    s << static_cast<PrintType>(m.coeff(i, 0));
    for(Index j = 1; j < m.cols(); ++j)
    {
      s << fmt.coeffSeparator;
      if(width) {
        s.fill(fmt.fill);
        s.width(width);
      }
      s << static_cast<PrintType>(m.coeff(i, j));
    }
    s << fmt.rowSuffix;
    if( i < m.rows() - 1)
      s << fmt.rowSeparator;
  }
  s << fmt.matSuffix;
  if(explicit_precision) s.precision(old_precision);
  if(width) {
    s.fill(old_fill_character);
    s.width(old_width);
  }
  return s;
}